

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_map_custom3(ggml_compute_params *params,ggml_tensor *dst)

{
  long in_RSI;
  undefined4 *in_RDI;
  ggml_map_custom3_op_params p;
  ggml_tensor *c;
  ggml_tensor *b;
  ggml_tensor *a;
  
  (**(code **)(in_RSI + 0x54))
            (in_RSI,*(undefined8 *)(in_RSI + 0x98),*(undefined8 *)(in_RSI + 0xa0),
             *(undefined8 *)(in_RSI + 0xa8),*in_RDI,in_RDI[1],*(undefined8 *)(in_RSI + 100),
             *(code **)(in_RSI + 0x54),*(undefined8 *)(in_RSI + 0x5c));
  return;
}

Assistant:

void ggml_compute_forward_map_custom3(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * a = dst->src[0];
    const ggml_tensor * b = dst->src[1];
    const ggml_tensor * c = dst->src[2];

    struct ggml_map_custom3_op_params p;
    memcpy(&p, dst->op_params, sizeof(p));

    p.fun(dst, a, b, c, params->ith, params->nth, p.userdata);
}